

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LenInstruction.cpp
# Opt level: O0

int get_ins_len(char f,char s)

{
  int iVar1;
  undefined4 *puVar2;
  int local_c;
  uint8_t f1;
  char s_local;
  char f_local;
  
  switch(f) {
  case '\x10':
    local_c = _ins_len(s);
    local_c = local_c + 2;
    break;
  case '\x11':
    local_c = 2;
    break;
  default:
    puVar2 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar2 = 0xf6;
    __cxa_throw(puVar2,&int::typeinfo,0);
  case ' ':
  case '!':
  case '\"':
  case '#':
  case '$':
    if (s < 'C') {
      iVar1 = _ins_len(s);
      return iVar1 + 2;
    }
  case '%':
    local_c = 2;
    break;
  case '0':
  case '1':
    local_c = 2;
    break;
  case '2':
    if ('B' < s) {
      puVar2 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar2 = 0xf6;
      __cxa_throw(puVar2,&int::typeinfo,0);
    }
    local_c = _ins_len(s);
    local_c = local_c + 2;
    break;
  case '@':
  case 'A':
  case 'B':
  case 'C':
  case 'D':
    local_c = _ins_len(s);
    local_c = local_c + 2;
    break;
  case 'P':
    if ('D' < s) {
      puVar2 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar2 = 0xf6;
      __cxa_throw(puVar2,&int::typeinfo,0);
    }
    local_c = _ins_len(s);
    local_c = local_c + 2;
    break;
  case 'Q':
    if ('D' < s) {
      puVar2 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar2 = 0xf6;
      __cxa_throw(puVar2,&int::typeinfo,0);
    }
    local_c = _ins_len(s);
    local_c = local_c + 2;
    break;
  case '_':
    local_c = 1;
    break;
  case '`':
    local_c = _ins_len(s);
    local_c = local_c + 2;
    break;
  case 'a':
    local_c = _ins_len(s);
    local_c = local_c + 2;
    break;
  case 'p':
    local_c = 1;
    break;
  case -0x20:
    local_c = 2;
  }
  return local_c;
}

Assistant:

int get_ins_len(char f, char s) {
	uint8_t f1 = (uint8_t)f;
	switch (f1)
	{
	case INS_MOV: {
		if (s <= '\x44')
			return	2 + _ins_len(s);
		else throw(LVM_EXECUTE_ERROR);
	}
	case INS_LEA: {
		if (s <= '\x44')
			return	2 + _ins_len(s);
		else throw(LVM_EXECUTE_ERROR);
	}
	case INS_INT: {
		//
		return 2;
	}
	case INS_JMP:case INS_JZ:case INS_JNZ:case INS_JH:case INS_JL: {
		return 2 + _ins_len(s);
	}
	case INS_INC:case INS_DEC: {
		return 2;
	}
	case INS_CMP: {
		if (s <= '\x42') return	2 + _ins_len(s);
		else throw(LVM_EXECUTE_ERROR);
	}
	case INS_ADD: case INS_SUB:case INS_XOR:case INS_AND:case INS_OR: {
		if (s <= '\x42')
		{
			return	2 + _ins_len(s);
		}
	}
	case INS_NOT: {
		return 2;
	}
	case INS_NOP: {
		return 1;
	}
	case INS_PUSH: {
		return 2 + _ins_len(s);
	}
	case INS_POP: {
		return 2;
	}
	case INS_CALL: {
		return 2 + _ins_len(s);
	}
	case INS_RET: {
		return 2 + _ins_len(s);
	}
	case INS_JIT_IN: {
		return 1;
	}
	default: {
		break;
	}

	}
	throw(LVM_EXECUTE_ERROR);
}